

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.h
# Opt level: O1

int SetDigitalRelayOntrak(ONTRAK *pOntrak,int channel,int bOpen)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int relay_state;
  char recvbuf [64];
  char sendbuf [64];
  int local_bc;
  timespec local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint8 local_78 [72];
  
  local_bc = 0;
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x3c] = '\0';
  local_78[0x3d] = '\0';
  local_78[0x3e] = '\0';
  local_78[0x3f] = '\0';
  pcVar4 = "0RESPA%d\r";
  if (bOpen == 0) {
    pcVar4 = "0SETPA%d\r";
  }
  sprintf((char *)local_78,pcVar4,channel);
  sVar2 = strlen((char *)local_78);
  iVar1 = WriteDataOntrak(pOntrak,local_78,(int)sVar2,pOntrak->bytedelayus);
  iVar7 = 1;
  pcVar4 = "Error writing data to a Ontrak. ";
  if (iVar1 == 0) {
    if ((pOntrak->bSaveRawData != 0) && ((FILE *)pOntrak->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_78,(long)(int)sVar2,1,(FILE *)pOntrak->pfSaveFile);
      fflush((FILE *)pOntrak->pfSaveFile);
    }
    local_b8.tv_sec = 0;
    local_b8.tv_nsec = 25000000;
    nanosleep(&local_b8,(timespec *)0x0);
    if (pOntrak->bCheckState == 0) {
      return 0;
    }
    local_78[0x30] = '\0';
    local_78[0x31] = '\0';
    local_78[0x32] = '\0';
    local_78[0x33] = '\0';
    local_78[0x34] = '\0';
    local_78[0x35] = '\0';
    local_78[0x36] = '\0';
    local_78[0x37] = '\0';
    local_78[0x38] = '\0';
    local_78[0x39] = '\0';
    local_78[0x3a] = '\0';
    local_78[0x3b] = '\0';
    local_78[0x3c] = '\0';
    local_78[0x3d] = '\0';
    local_78[0x3e] = '\0';
    local_78[0x3f] = '\0';
    local_78[0x20] = '\0';
    local_78[0x21] = '\0';
    local_78[0x22] = '\0';
    local_78[0x23] = '\0';
    local_78[0x24] = '\0';
    local_78[0x25] = '\0';
    local_78[0x26] = '\0';
    local_78[0x27] = '\0';
    local_78[0x28] = '\0';
    local_78[0x29] = '\0';
    local_78[0x2a] = '\0';
    local_78[0x2b] = '\0';
    local_78[0x2c] = '\0';
    local_78[0x2d] = '\0';
    local_78[0x2e] = '\0';
    local_78[0x2f] = '\0';
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    local_78[0x18] = '\0';
    local_78[0x19] = '\0';
    local_78[0x1a] = '\0';
    local_78[0x1b] = '\0';
    local_78[0x1c] = '\0';
    local_78[0x1d] = '\0';
    local_78[0x1e] = '\0';
    local_78[0x1f] = '\0';
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '\0';
    local_78[9] = '\0';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    sprintf((char *)local_78,"0RPA%d\r",channel);
    sVar2 = strlen((char *)local_78);
    iVar1 = WriteDataOntrak(pOntrak,local_78,(int)sVar2,pOntrak->bytedelayus);
    if (iVar1 == 0) {
      if ((pOntrak->bSaveRawData != 0) && ((FILE *)pOntrak->pfSaveFile != (FILE *)0x0)) {
        fwrite(local_78,(long)(int)sVar2,1,(FILE *)pOntrak->pfSaveFile);
        fflush((FILE *)pOntrak->pfSaveFile);
      }
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8.tv_sec = 0;
      local_b8.tv_nsec = 0;
      iVar1 = (pOntrak->RS232Port).DevType;
      pcVar4 = "Error reading data from a Ontrak. ";
      iVar7 = 1;
      if (iVar1 - 1U < 4) {
        iVar1 = (pOntrak->RS232Port).s;
        uVar6 = 0;
        do {
          sVar3 = recv(iVar1,(void *)((long)&local_b8.tv_sec + uVar6),(long)(2 - (int)uVar6),0);
          if ((int)sVar3 < 1) goto LAB_001b46ff;
          uVar5 = (int)uVar6 + (int)sVar3;
          uVar6 = (ulong)uVar5;
        } while ((int)uVar5 < 2);
      }
      else {
        if (iVar1 != 0) goto LAB_001b46ff;
        iVar1 = *(int *)&(pOntrak->RS232Port).hDev;
        uVar6 = 0;
        do {
          sVar3 = read(iVar1,(void *)((long)&local_b8.tv_sec + uVar6),(ulong)(2 - (int)uVar6));
          if ((int)sVar3 < 1) goto LAB_001b46ff;
          uVar5 = (int)uVar6 + (int)sVar3;
          uVar6 = (ulong)uVar5;
        } while (uVar5 < 2);
      }
      if ((pOntrak->bSaveRawData != 0) && ((FILE *)pOntrak->pfSaveFile != (FILE *)0x0)) {
        fwrite(&local_b8,2,1,(FILE *)pOntrak->pfSaveFile);
        fflush((FILE *)pOntrak->pfSaveFile);
      }
      iVar1 = __isoc99_sscanf(&local_b8,"%d",&local_bc);
      if (iVar1 == 1) {
        pcVar4 = "Error reading data from a Ontrak : Inconsitent digital relay state. ";
        if ((local_bc != 1 || bOpen != 1) && (bOpen != 0 || local_bc != 0)) {
          return 0;
        }
      }
      else {
        iVar7 = 4;
        pcVar4 = "Error reading data from a Ontrak : Invalid data. ";
      }
    }
    else {
      iVar7 = 1;
    }
  }
LAB_001b46ff:
  puts(pcVar4);
  return iVar7;
}

Assistant:

inline int SetDigitalRelayOntrak(ONTRAK* pOntrak, int channel, int bOpen)
{
	char sendbuf[MAX_NB_BYTES_ONTRAK];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_ONTRAK];
	int recvbuflen = 0;
	int relay_state = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	if (bOpen)
	{
		sprintf(sendbuf, "0RESPA%d\r", channel);
	}
	else
	{
		sprintf(sendbuf, "0SETPA%d\r", channel);
	}
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataOntrak(pOntrak, (unsigned char*)sendbuf, sendbuflen, pOntrak->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Ontrak. \n");
		return EXIT_FAILURE;
	}
	if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pOntrak->pfSaveFile);
		fflush(pOntrak->pfSaveFile);
	}

	mSleep(25);

	if (pOntrak->bCheckState)
	{
		// Check state : 0RPA%d\r returns 0 if reset or 1 if set.

		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		sprintf(sendbuf, "0RPA%d\r", channel);
		sendbuflen = (int)strlen(sendbuf);

		if (WriteDataOntrak(pOntrak, (unsigned char*)sendbuf, sendbuflen, pOntrak->bytedelayus) != EXIT_SUCCESS)
		{
			printf("Error writing data to a Ontrak. \n");
			return EXIT_FAILURE;
		}
		if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
		{
			fwrite(sendbuf, sendbuflen, 1, pOntrak->pfSaveFile);
			fflush(pOntrak->pfSaveFile);
		}

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = 2; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pOntrak->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Ontrak. \n");
			return EXIT_FAILURE;
		}
		if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pOntrak->pfSaveFile);
			fflush(pOntrak->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if (sscanf(recvbuf, "%d", &relay_state) != 1)
		{
			printf("Error reading data from a Ontrak : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}

		if (((bOpen == 1)&&(relay_state == 1))||((bOpen == 0)&&(relay_state == 0)))
		{
			printf("Error reading data from a Ontrak : Inconsitent digital relay state. \n");
			return EXIT_FAILURE;
		}
	}

	return EXIT_SUCCESS;
}